

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

StrokeData * __thiscall
lunasvg::SVGGraphicsElement::getStrokeData
          (StrokeData *__return_storage_ptr__,SVGGraphicsElement *this,SVGLayoutState *state)

{
  LineCap lineCap;
  LineJoin lineJoin;
  bool bVar1;
  Length *pLVar2;
  LengthList *this_00;
  float fVar3;
  vector<float,_std::allocator<float>_> local_a0;
  float local_84;
  reference local_80;
  Length *dash;
  const_iterator __end1;
  const_iterator __begin1;
  LengthList *__range1;
  DashArray dashArray;
  undefined1 local_30 [8];
  LengthContext lengthContext;
  SVGLayoutState *state_local;
  SVGGraphicsElement *this_local;
  StrokeData *strokeData;
  
  lengthContext._8_8_ = state;
  LengthContext::LengthContext((LengthContext *)local_30,&this->super_SVGElement,UserSpaceOnUse);
  pLVar2 = SVGLayoutState::stroke_width((SVGLayoutState *)lengthContext._8_8_);
  fVar3 = LengthContext::valueForLength((LengthContext *)local_30,pLVar2,Diagonal);
  StrokeData::StrokeData(__return_storage_ptr__,fVar3);
  fVar3 = SVGLayoutState::stroke_miterlimit((SVGLayoutState *)lengthContext._8_8_);
  StrokeData::setMiterLimit(__return_storage_ptr__,fVar3);
  lineCap = SVGLayoutState::stroke_linecap((SVGLayoutState *)lengthContext._8_8_);
  StrokeData::setLineCap(__return_storage_ptr__,lineCap);
  lineJoin = SVGLayoutState::stroke_linejoin((SVGLayoutState *)lengthContext._8_8_);
  StrokeData::setLineJoin(__return_storage_ptr__,lineJoin);
  pLVar2 = SVGLayoutState::stroke_dashoffset((SVGLayoutState *)lengthContext._8_8_);
  fVar3 = LengthContext::valueForLength((LengthContext *)local_30,pLVar2,Diagonal);
  StrokeData::setDashOffset(__return_storage_ptr__,fVar3);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  this_00 = SVGLayoutState::stroke_dasharray((SVGLayoutState *)lengthContext._8_8_);
  __end1 = std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::begin(this_00);
  dash = (Length *)std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_lunasvg::Length_*,_std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>_>
                                     *)&dash), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_lunasvg::Length_*,_std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>_>
               ::operator*(&__end1);
    local_84 = LengthContext::valueForLength((LengthContext *)local_30,local_80,Diagonal);
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&__range1,&local_84);
    __gnu_cxx::
    __normal_iterator<const_lunasvg::Length_*,_std::vector<lunasvg::Length,_std::allocator<lunasvg::Length>_>_>
    ::operator++(&__end1);
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&local_a0,(vector<float,_std::allocator<float>_> *)&__range1);
  StrokeData::setDashArray(__return_storage_ptr__,&local_a0);
  std::vector<float,_std::allocator<float>_>::~vector(&local_a0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

StrokeData SVGGraphicsElement::getStrokeData(const SVGLayoutState& state) const
{
    LengthContext lengthContext(this);
    StrokeData strokeData(lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal));
    strokeData.setMiterLimit(state.stroke_miterlimit());
    strokeData.setLineCap(state.stroke_linecap());
    strokeData.setLineJoin(state.stroke_linejoin());
    strokeData.setDashOffset(lengthContext.valueForLength(state.stroke_dashoffset(), LengthDirection::Diagonal));

    DashArray dashArray;
    for(const auto& dash : state.stroke_dasharray())
        dashArray.push_back(lengthContext.valueForLength(dash, LengthDirection::Diagonal));
    strokeData.setDashArray(std::move(dashArray));
    return strokeData;
}